

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

mcpl_particle_t * mcpl_get_empty_particle(mcpl_outfile_t of)

{
  char *pcVar1;
  long in_RDI;
  mcpl_outfileinternal_t *f;
  
  if (*(long *)(in_RDI + 0x78) == 0) {
    pcVar1 = mcpl_internal_calloc((size_t)of.internal,(size_t)f);
    *(char **)(in_RDI + 0x78) = pcVar1;
  }
  else {
    mcpl_error((char *)0x1044fb);
  }
  return *(mcpl_particle_t **)(in_RDI + 0x78);
}

Assistant:

mcpl_particle_t* mcpl_get_empty_particle(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  if (f->puser) {
    //Calling more than once. This could be innocent, or it could indicate
    //problems in multi-threaded user-code. Better disallow and give an error:
    mcpl_error("mcpl_get_empty_particle must not be"
               " called more than once per output file");
  } else {
    f->puser = (mcpl_particle_t*)mcpl_internal_calloc(1,sizeof(mcpl_particle_t));
  }
  return f->puser;
}